

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

void __thiscall rcg::Buffer::~Buffer(Buffer *this)

{
  if ((this->chunkadapter).super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    GenApi_3_4::CChunkAdapter::DetachBuffer();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->chunkadapter).
              super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->nodemap).
              super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

Buffer::~Buffer()
{
  if (chunkadapter)
  {
    chunkadapter->DetachBuffer();
  }
}